

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

wchar_t read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  mtree *mtree;
  bool bVar2;
  int iVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  mode_t mVar6;
  mtree_entry *pmVar7;
  int *piVar8;
  la_int64_t lVar9;
  char *pcVar10;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar11;
  archive_string *paVar12;
  ushort **ppuVar13;
  mtree_entry **ppmVar14;
  long lVar15;
  size_t sVar16;
  archive_rb_node *paVar17;
  archive_rb_node *paVar18;
  size_t len;
  byte *pbVar19;
  char *pcVar20;
  char *pcVar21;
  size_t sVar22;
  byte *pbVar23;
  timespec *ptVar24;
  byte *pbVar25;
  long lVar26;
  ulong uVar27;
  byte *__s1;
  archive_entry **ppaVar28;
  ulong uVar29;
  long lVar30;
  stat *__buf;
  mtree_option *global;
  archive_entry *sparse_entry;
  stat_conflict st_storage;
  archive_entry *local_128;
  archive_string *local_120;
  archive_read *local_118;
  mtree_entry *local_110;
  wchar_t local_104;
  byte *local_100;
  mtree_entry *local_f8;
  mtree_entry *local_f0;
  archive_rb_tree *local_e8;
  archive_rb_tree *local_e0;
  int local_d8 [2];
  mtree_entry **local_d0;
  archive_entry *local_c8;
  stat local_c0;
  
  mtree = (mtree *)a->format->data;
  local_118 = a;
  local_c8 = entry;
  if (L'\xffffffff' < mtree->fd) {
    close(mtree->fd);
    mtree->fd = L'\xffffffff';
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      return L'\xffffffe2';
    }
    local_d0 = &mtree->entries;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = L'\x00080000';
    mtree->archive_format_name = "mtree";
    local_128 = (archive_entry *)0x0;
    detect_form(local_118,local_d8);
    local_e0 = &mtree->rbtree;
    local_e8 = (archive_rb_tree *)0x1;
    local_110 = (mtree_entry *)0x0;
LAB_0014dc0a:
    __s = __archive_read_ahead(local_118,1,(ssize_t *)&local_c0);
    if (__s != (void *)0x0) {
      lVar26 = 0;
      uVar27 = 0;
      do {
        uVar29 = 0xffffffffffffffe2;
        paVar12 = local_120;
        if ((long)local_c0.st_dev < 0) goto LAB_0014dd50;
        pvVar11 = memchr(__s,10,local_c0.st_dev);
        if (pvVar11 != (void *)0x0) {
          local_c0.st_dev = (long)pvVar11 + (1 - (long)__s);
        }
        if (0xffff < (long)(local_c0.st_dev + uVar27)) {
          iVar3 = 0x54;
          pcVar10 = "Line too long";
LAB_0014dfa4:
          archive_set_error(&local_118->archive,iVar3,pcVar10);
          paVar12 = local_120;
          goto LAB_0014dd50;
        }
        paVar12 = archive_string_ensure((archive_string *)mtree,local_c0.st_dev + uVar27 + 1);
        if (paVar12 == (archive_string *)0x0) {
          iVar3 = 0xc;
          pcVar10 = "Can\'t allocate working buffer";
          goto LAB_0014dfa4;
        }
        memcpy((mtree->line).s + uVar27,__s,local_c0.st_dev);
        __archive_read_consume(local_118,local_c0.st_dev);
        uVar29 = uVar27 + local_c0.st_dev;
        (mtree->line).s[uVar29] = '\0';
        paVar12 = (archive_string *)(mtree->line).s;
        pbVar25 = (byte *)((long)paVar12 + lVar26);
LAB_0014dcc5:
        bVar1 = *pbVar25;
        if (bVar1 < 0x5c) {
          if (bVar1 == 0x23) {
            if (pvVar11 == (void *)0x0) goto LAB_0014dd09;
          }
          else {
            if (bVar1 == 0) goto LAB_0014dd09;
            if (bVar1 == 10) goto LAB_0014dd50;
          }
LAB_0014dcfa:
          pbVar25 = pbVar25 + 1;
          goto LAB_0014dcc5;
        }
        if ((bVar1 != 0x5c) || (pbVar25[1] == 0)) goto LAB_0014dcfa;
        if (pbVar25[1] != 10) {
          pbVar25 = pbVar25 + 1;
          goto LAB_0014dcfa;
        }
        *(byte *)((long)paVar12 + (uVar29 - 2)) = 0;
        uVar29 = uVar29 - 2;
LAB_0014dd09:
        lVar26 = (long)pbVar25 - (long)(mtree->line).s;
        __s = __archive_read_ahead(local_118,1,(ssize_t *)&local_c0);
        uVar27 = uVar29;
      } while (__s != (void *)0x0);
    }
    uVar29 = 0;
    paVar12 = local_120;
LAB_0014dd50:
    if (uVar29 == 0) {
      mtree->this_entry = mtree->entries;
      free_options((mtree_option *)local_128);
      wVar4 = L'\0';
      goto LAB_0014e369;
    }
    if (-1 < (long)uVar29) {
      lVar26 = 0;
      pbVar25 = (byte *)paVar12;
      while( true ) {
        pbVar25 = pbVar25 + 1;
        bVar1 = *(byte *)((long)paVar12 + lVar26);
        uVar27 = (ulong)bVar1;
        if (0x23 < uVar27) break;
        if ((0x100000200U >> (uVar27 & 0x3f) & 1) == 0) {
          if ((0x800002401U >> (uVar27 & 0x3f) & 1) != 0) goto LAB_0014dd8f;
          break;
        }
        lVar26 = lVar26 + 1;
      }
      pbVar23 = (byte *)((long)paVar12 + lVar26);
      lVar30 = uVar29 - lVar26;
      __s1 = pbVar23;
      local_120 = paVar12;
      if (pbVar23 < pbVar23 + lVar30 + -1) {
        local_100 = pbVar23;
        ppuVar13 = __ctype_b_loc();
        pbVar19 = local_100;
        do {
          if ((*pbVar19 != 9) && (((*ppuVar13)[*pbVar19] & 0x4000) == 0)) goto LAB_0014e327;
          pbVar19 = pbVar19 + 1;
          __s1 = local_100;
        } while (pbVar19 < pbVar23 + lVar30 + -1);
      }
      iVar3 = local_d8[0];
      if (bVar1 != 0x2f) {
        local_100 = __s1;
        pmVar7 = (mtree_entry *)malloc(0x40);
        pbVar23 = local_100;
        if (pmVar7 != (mtree_entry *)0x0) {
          *(undefined8 *)((long)&pmVar7->options + 2) = 0;
          *(undefined8 *)((long)&pmVar7->name + 2) = 0;
          pmVar7->next = (mtree_entry *)0x0;
          pmVar7->options = (mtree_option *)0x0;
          ppmVar14 = &local_110->next;
          if (local_110 == (mtree_entry *)0x0) {
            ppmVar14 = local_d0;
          }
          *ppmVar14 = pmVar7;
          local_f8 = pmVar7;
          local_f0 = pmVar7;
          if (iVar3 == L'\0') {
            pbVar25 = (byte *)strcspn((char *)local_100," \t\r\n");
            pbVar23 = pbVar25 + (long)pbVar23;
            local_110 = (mtree_entry *)(pbVar23 + lVar30);
          }
          else {
            do {
              if (lVar30 < 1) break;
              bVar2 = false;
              if (((ulong)*(byte *)((long)local_120 + lVar26 + -1 + lVar30) < 0x21) &&
                 ((0x100002600U >> ((ulong)*(byte *)((long)local_120 + lVar26 + -1 + lVar30) & 0x3f)
                  & 1) != 0)) {
                lVar30 = lVar30 + -1;
                bVar2 = true;
              }
            } while (bVar2);
            lVar15 = lVar30;
            local_110 = (mtree_entry *)local_100;
            if (0 < lVar30) {
              do {
                if (((ulong)pbVar25[-1] < 0x21) &&
                   ((0x100002600U >> ((ulong)pbVar25[-1] & 0x3f) & 1) != 0)) {
                  local_110 = (mtree_entry *)pbVar25;
                }
                pbVar25 = pbVar25 + 1;
                lVar15 = lVar15 + -1;
              } while (lVar15 != 0);
            }
            pbVar25 = local_100 + (lVar30 - (long)local_110);
            local_100 = (byte *)local_110;
          }
          pcVar10 = (char *)malloc((size_t)(pbVar25 + 1));
          local_f8->name = pcVar10;
          if (pcVar10 == (char *)0x0) {
            piVar8 = __errno_location();
            archive_set_error(&local_118->archive,*piVar8,"Can\'t allocate memory");
            uVar29 = 0xffffffe2;
LAB_0014e18d:
            local_110 = local_f8;
            paVar12 = local_120;
            goto LAB_0014e308;
          }
          memcpy(pcVar10,local_100,(size_t)pbVar25);
          pmVar7 = local_f8;
          pcVar10[(long)pbVar25] = '\0';
          parse_escapes(pcVar10,local_f8);
          pmVar7->next_dup = (mtree_entry *)0x0;
          if (((pmVar7->full != '\0') &&
              (iVar3 = __archive_rb_tree_insert_node(local_e0,&pmVar7->rbnode), iVar3 == 0)) &&
             (paVar17 = __archive_rb_tree_find_node(local_e0,pmVar7->name),
             paVar17 != (archive_rb_node *)0x0)) {
            do {
              paVar18 = paVar17;
              paVar17 = paVar18[1].rb_nodes[0];
            } while (paVar17 != (archive_rb_node *)0x0);
            paVar18[1].rb_nodes[0] = &pmVar7->rbnode;
          }
          local_f0 = (mtree_entry *)&local_f0->options;
          ppaVar28 = &local_128;
          do {
            ppaVar28 = (archive_entry **)*ppaVar28;
            if (ppaVar28 == (archive_entry **)0x0) goto LAB_0014e1a3;
            pcVar10 = (char *)((long *)ppaVar28)[1];
            sVar16 = strlen(pcVar10);
            wVar4 = add_option(local_118,(mtree_option **)local_f0,pcVar10,sVar16);
          } while (wVar4 == L'\0');
          goto LAB_0014e234;
        }
        piVar8 = __errno_location();
        archive_set_error(&local_118->archive,*piVar8,"Can\'t allocate memory");
        uVar29 = 0xffffffe2;
        paVar12 = local_120;
        goto LAB_0014e308;
      }
      if ((lVar30 < 5) || (iVar3 = strncmp((char *)__s1,"/set",4), iVar3 != 0)) {
        if (((6 < lVar30) &&
            (iVar3 = strncmp((char *)__s1,"/unset",6), paVar12 = local_120, iVar3 == 0)) &&
           ((*(byte *)((long)local_120 + lVar26 + 6) == 0x20 ||
            (*(byte *)((long)local_120 + lVar26 + 6) == 9)))) {
          pbVar25 = (byte *)((long)local_120 + lVar26 + 6);
          pcVar10 = strchr((char *)pbVar25,0x3d);
          if (pcVar10 == (char *)0x0) {
            sVar16 = strspn((char *)pbVar25," \t\r\n");
            uVar29 = 0;
            if (*(byte *)((long)paVar12 + lVar26 + 6 + sVar16) != 0) {
              pbVar25 = (byte *)((long)paVar12 + lVar26 + sVar16 + 6);
              do {
                sVar16 = strcspn((char *)pbVar25," \t\r\n");
                if ((sVar16 == 3) && (iVar3 = strncmp((char *)pbVar25,"all",3), iVar3 == 0)) {
                  free_options((mtree_option *)local_128);
                  local_128 = (archive_entry *)0x0;
                }
                else {
                  remove_option((mtree_option **)&local_128,(char *)pbVar25,sVar16);
                }
                pbVar23 = pbVar25 + sVar16;
                sVar16 = strspn((char *)pbVar23," \t\r\n");
                pbVar25 = pbVar23 + sVar16;
                paVar12 = local_120;
              } while (pbVar23[sVar16] != 0);
            }
          }
          else {
            archive_set_error(&local_118->archive,-1,"/unset shall not contain `=\'");
            uVar29 = 0xffffffe2;
          }
          goto LAB_0014e308;
        }
      }
      else if ((*(byte *)((long)local_120 + lVar26 + 4) == 0x20) ||
              (*(byte *)((long)local_120 + lVar26 + 4) == 9)) {
        pmVar7 = (mtree_entry *)((long)local_120 + lVar26 + 4);
        do {
          sVar16 = strspn((char *)pmVar7," \t\r\n");
          if (*(byte *)((long)(pmVar7->rbnode).rb_nodes + sVar16) == 0) {
            uVar29 = 0;
            paVar12 = local_120;
            goto LAB_0014e308;
          }
          pbVar25 = (byte *)((long)(pmVar7->rbnode).rb_nodes + sVar16);
          sVar16 = strcspn((char *)pbVar25," \t\r\n");
          local_f0 = (mtree_entry *)(pbVar25 + sVar16);
          pmVar7 = (mtree_entry *)strchr((char *)pbVar25,0x3d);
          sVar22 = (long)pmVar7 - (long)pbVar25;
          if ((mtree_entry *)(pbVar25 + sVar16) < pmVar7) {
            sVar22 = sVar16;
          }
          remove_option((mtree_option **)&local_128,(char *)pbVar25,sVar22);
          wVar4 = add_option(local_118,(mtree_option **)&local_128,(char *)pbVar25,sVar16);
          pmVar7 = local_f0;
        } while (wVar4 == L'\0');
        uVar29 = (ulong)(uint)wVar4;
        paVar12 = local_120;
        goto LAB_0014e308;
      }
LAB_0014e327:
      archive_set_error(&local_118->archive,0x54,"Can\'t parse line %ju",local_e8);
      free_options((mtree_option *)local_128);
      wVar4 = L'\xffffffe2';
      goto LAB_0014e369;
    }
LAB_0014e311:
    wVar4 = (wchar_t)uVar29;
    free_options((mtree_option *)local_128);
LAB_0014e369:
    if (wVar4 != L'\0') {
      return wVar4;
    }
  }
  (local_118->archive).archive_format = mtree->archive_format;
  (local_118->archive).archive_format_name = mtree->archive_format_name;
  pmVar7 = mtree->this_entry;
  if (pmVar7 != (mtree_entry *)0x0) {
    local_e8 = &mtree->rbtree;
    paVar12 = &mtree->current_dir;
    local_120 = paVar12;
    do {
      iVar3 = strcmp(pmVar7->name,"..");
      if (iVar3 == 0) {
        pmVar7->used = '\x01';
        sVar22 = (mtree->current_dir).length;
        if (sVar22 != 0) {
          pcVar10 = (mtree->current_dir).s;
          pcVar20 = pcVar10 + sVar22;
          do {
            pcVar21 = pcVar20;
            pcVar20 = pcVar21 + -1;
            if (pcVar20 < pcVar10) break;
          } while (*pcVar20 != '/');
          pcVar21 = pcVar21 + -2;
          if (pcVar20 < pcVar10) {
            pcVar21 = pcVar20;
          }
          (mtree->current_dir).length = (size_t)(pcVar21 + (1 - (long)pcVar10));
        }
      }
      if (pmVar7->used == '\0') {
        local_128 = local_c8;
        pmVar7->used = '\x01';
        archive_entry_set_filetype(local_c8,0x8000);
        archive_entry_set_size(local_128,0);
        (mtree->contents_name).length = 0;
        local_104 = L'\0';
        wVar4 = parse_line(local_118,local_128,mtree,pmVar7,&local_104);
        if (pmVar7->full == '\0') {
          sVar22 = (mtree->current_dir).length;
          if (sVar22 != 0) {
            archive_strcat(paVar12,"/");
          }
          archive_strcat(paVar12,pmVar7->name);
          archive_entry_copy_pathname(local_128,paVar12->s);
          mVar6 = archive_entry_filetype(local_128);
          if (mVar6 != 0x4000) {
            (mtree->current_dir).length = sVar22;
          }
        }
        else {
          archive_entry_copy_pathname(local_128,pmVar7->name);
          for (pmVar7 = (mtree_entry *)__archive_rb_tree_find_node(local_e8,pmVar7->name);
              pmVar7 != (mtree_entry *)0x0; pmVar7 = pmVar7->next_dup) {
            if ((pmVar7->full != '\0') && (pmVar7->used == '\0')) {
              pmVar7->used = '\x01';
              wVar5 = parse_line(local_118,local_128,mtree,pmVar7,&local_104);
              if (wVar5 < wVar4) {
                wVar4 = wVar5;
              }
            }
          }
        }
        if (mtree->checkfs == '\0') {
LAB_0014dad6:
          lVar9 = archive_entry_size(local_128);
          mtree->cur_size = lVar9;
          mtree->offset = 0;
          bVar2 = true;
          wVar5 = wVar4;
        }
        else {
          mtree->fd = L'\xffffffff';
          if ((mtree->contents_name).length == 0) {
            pcVar10 = archive_entry_pathname(local_128);
          }
          else {
            pcVar10 = (mtree->contents_name).s;
          }
          __buf = &local_c0;
          mVar6 = archive_entry_filetype(local_128);
          if ((mVar6 == 0x8000) || (mVar6 = archive_entry_filetype(local_128), mVar6 == 0x4000)) {
            wVar5 = open(pcVar10,0x80000);
            mtree->fd = wVar5;
            __archive_ensure_cloexec_flag(wVar5);
            if (mtree->fd == L'\xffffffff') {
              piVar8 = __errno_location();
              if ((*piVar8 != 2) || ((mtree->contents_name).length != 0)) {
                archive_set_error(&local_118->archive,*piVar8,"Can\'t open %s",pcVar10);
                wVar4 = L'\xffffffec';
              }
            }
          }
          if (mtree->fd < L'\0') {
            iVar3 = lstat(pcVar10,__buf);
            if (iVar3 == -1) goto LAB_0014d89d;
            ptVar24 = &local_c0.st_mtim;
          }
          else {
            iVar3 = fstat(mtree->fd,__buf);
            ptVar24 = &local_c0.st_mtim;
            if (iVar3 == -1) {
              piVar8 = __errno_location();
              archive_set_error(&local_118->archive,*piVar8,"Could not fstat %s",pcVar10);
              close(mtree->fd);
              mtree->fd = L'\xffffffff';
              wVar4 = L'\xffffffec';
LAB_0014d89d:
              ptVar24 = (timespec *)0x58;
              __buf = (stat *)0x0;
            }
          }
          if (__buf == (stat *)0x0) {
            bVar2 = false;
            wVar5 = L'\0';
            if ((local_104 & 0x800U) == 0) goto LAB_0014dad6;
          }
          else {
            if (((((((__buf->st_mode & 0xf000) == 0x8000) &&
                   (mVar6 = archive_entry_filetype(local_128), mVar6 == 0x8000)) ||
                  (((__buf->st_mode & 0xf000) == 0xa000 &&
                   (mVar6 = archive_entry_filetype(local_128), mVar6 == 0xa000)))) ||
                 ((((~__buf->st_mode & 0xc000) == 0 &&
                   (mVar6 = archive_entry_filetype(local_128), mVar6 == 0xc000)) ||
                  (((__buf->st_mode & 0xf000) == 0x2000 &&
                   (mVar6 = archive_entry_filetype(local_128), mVar6 == 0x2000)))))) ||
                ((((__buf->st_mode & 0xf000) == 0x6000 &&
                  (mVar6 = archive_entry_filetype(local_128), mVar6 == 0x6000)) ||
                 (((__buf->st_mode & 0xf000) == 0x4000 &&
                  (mVar6 = archive_entry_filetype(local_128), mVar6 == 0x4000)))))) ||
               (((__buf->st_mode & 0xf000) == 0x1000 &&
                (mVar6 = archive_entry_filetype(local_128), mVar6 == 0x1000)))) {
              wVar5 = local_104;
              if (((local_104 & 0x1001U) != 1) &&
                 ((mVar6 = archive_entry_filetype(local_128), mVar6 == 0x2000 ||
                  (mVar6 = archive_entry_filetype(local_128), mVar6 == 0x6000)))) {
                archive_entry_set_rdev(local_128,__buf->st_rdev);
              }
              if ((wVar5 & 0xcU) == 0 || ((uint)wVar5 >> 0xc & 1) != 0) {
                archive_entry_set_gid(local_128,(ulong)__buf->st_gid);
              }
              if ((wVar5 & 0x600U) == 0 || ((uint)wVar5 >> 0xc & 1) != 0) {
                archive_entry_set_uid(local_128,(ulong)__buf->st_uid);
              }
              if ((wVar5 & 0x1010U) != 0x10) {
                archive_entry_set_mtime(local_128,(__buf->st_mtim).tv_sec,ptVar24->tv_nsec);
              }
              if ((wVar5 & 0x1020U) != 0x20) {
                archive_entry_set_nlink(local_128,(uint)__buf->st_nlink);
              }
              if ((wVar5 & 0x1040U) != 0x40) {
                archive_entry_set_perm(local_128,__buf->st_mode);
              }
              if ((wVar5 & 0x1080U) != 0x80) {
                archive_entry_set_size(local_128,__buf->st_size);
              }
              archive_entry_set_ino(local_128,__buf->st_ino);
              archive_entry_set_dev(local_128,__buf->st_dev);
              archive_entry_linkify(mtree->resolver,&local_128,(archive_entry **)local_d8);
              goto LAB_0014dad6;
            }
            if (L'\xffffffff' < mtree->fd) {
              close(mtree->fd);
            }
            mtree->fd = L'\xffffffff';
            wVar5 = wVar4;
            if ((local_104 & 0x800U) == 0) {
              bVar2 = true;
              if (wVar4 == L'\0') {
                pcVar10 = archive_entry_pathname(local_128);
                archive_set_error(&local_118->archive,-1,
                                  "mtree specification has different type for %s",pcVar10);
                wVar5 = L'\xffffffec';
                bVar2 = true;
              }
            }
            else {
              bVar2 = false;
            }
          }
        }
        paVar12 = local_120;
        if (bVar2) {
          return wVar5;
        }
      }
      pmVar7 = mtree->this_entry->next;
      mtree->this_entry = pmVar7;
    } while (pmVar7 != (mtree_entry *)0x0);
  }
  return L'\x01';
  while( true ) {
    len = strcspn((char *)pbVar23," \t\r\n");
    local_100 = pbVar23 + len;
    pbVar25 = (byte *)strchr((char *)pbVar23,0x3d);
    pmVar7 = local_f0;
    sVar16 = (long)pbVar25 - (long)pbVar23;
    if (pbVar23 + len < pbVar25) {
      sVar16 = len;
    }
    if (pbVar25 == (byte *)0x0) {
      sVar16 = len;
    }
    remove_option((mtree_option **)local_f0,(char *)pbVar23,sVar16);
    wVar4 = add_option(local_118,(mtree_option **)pmVar7,(char *)pbVar23,len);
    pbVar23 = local_100;
    if (wVar4 != L'\0') break;
LAB_0014e1a3:
    sVar16 = strspn((char *)pbVar23," \t\r\n");
    uVar29 = 0;
    if ((pbVar23[sVar16] == 0) || (pbVar23 = pbVar23 + sVar16, local_110 <= pbVar23))
    goto LAB_0014e18d;
  }
LAB_0014e234:
  uVar29 = (ulong)(uint)wVar4;
  local_110 = local_f8;
  paVar12 = local_120;
LAB_0014e308:
  if ((int)uVar29 != 0) goto LAB_0014e311;
LAB_0014dd8f:
  local_e8 = (archive_rb_tree *)((long)local_e8 + 1);
  local_120 = (archive_string *)((long)paVar12 + lVar26);
  goto LAB_0014dc0a;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry,
            char head_type)
{
  const void *h;
  const char *p, *endp;
  struct rar *rar;
  struct rar_header rar_header;
  struct rar_file_header file_header;
  int64_t header_size;
  unsigned filename_size, end;
  char *filename;
  char *strp;
  char packed_size[8];
  char unp_size[8];
  int ttime;
  struct archive_string_conv *sconv, *fn_sconv;
  unsigned long crc32_val;
  int ret = (ARCHIVE_OK), ret2;

  rar = (struct rar *)(a->format->data);

  /* Setup a string conversion object for non-rar-unicode filenames. */
  sconv = rar->opt_sconv;
  if (sconv == NULL) {
    if (!rar->init_default_conversion) {
      rar->sconv_default =
          archive_string_default_conversion_for_read(
            &(a->archive));
      rar->init_default_conversion = 1;
    }
    sconv = rar->sconv_default;
  }


  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;
  memcpy(&rar_header, p, sizeof(rar_header));
  rar->file_flags = archive_le16dec(rar_header.flags);
  header_size = archive_le16dec(rar_header.size);
  if (header_size < (int64_t)sizeof(file_header) + 7) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid header size");
    return (ARCHIVE_FATAL);
  }
  crc32_val = crc32(0, (const unsigned char *)p + 2, 7 - 2);
  __archive_read_consume(a, 7);

  if (!(rar->file_flags & FHD_SOLID))
  {
    rar->compression_method = 0;
    rar->packed_size = 0;
    rar->unp_size = 0;
    rar->mtime = 0;
    rar->ctime = 0;
    rar->atime = 0;
    rar->arctime = 0;
    rar->mode = 0;
    memset(&rar->salt, 0, sizeof(rar->salt));
    rar->atime = 0;
    rar->ansec = 0;
    rar->ctime = 0;
    rar->cnsec = 0;
    rar->mtime = 0;
    rar->mnsec = 0;
    rar->arctime = 0;
    rar->arcnsec = 0;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR solid archive support unavailable.");
    return (ARCHIVE_FATAL);
  }

  if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);

  /* File Header CRC check. */
  crc32_val = crc32(crc32_val, h, (unsigned)(header_size - 7));
  if ((crc32_val & 0xffff) != archive_le16dec(rar_header.crc)) {
#ifndef DONT_FAIL_ON_CRC_ERROR
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Header CRC error");
    return (ARCHIVE_FATAL);
#endif
  }
  /* If no CRC error, Go on parsing File Header. */
  p = h;
  endp = p + header_size - 7;
  memcpy(&file_header, p, sizeof(file_header));
  p += sizeof(file_header);

  rar->compression_method = file_header.method;

  ttime = archive_le32dec(file_header.file_time);
  rar->mtime = get_time(ttime);

  rar->file_crc = archive_le32dec(file_header.file_crc);

  if (rar->file_flags & FHD_PASSWORD)
  {
	archive_entry_set_is_data_encrypted(entry, 1);
	rar->has_encrypted_entries = 1;
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR encryption support unavailable.");
    /* Since it is only the data part itself that is encrypted we can at least
       extract information about the currently processed entry and don't need
       to return ARCHIVE_FATAL here. */
    /*return (ARCHIVE_FATAL);*/
  }

  if (rar->file_flags & FHD_LARGE)
  {
    memcpy(packed_size, file_header.pack_size, 4);
    memcpy(packed_size + 4, p, 4); /* High pack size */
    p += 4;
    memcpy(unp_size, file_header.unp_size, 4);
    memcpy(unp_size + 4, p, 4); /* High unpack size */
    p += 4;
    rar->packed_size = archive_le64dec(&packed_size);
    rar->unp_size = archive_le64dec(&unp_size);
  }
  else
  {
    rar->packed_size = archive_le32dec(file_header.pack_size);
    rar->unp_size = archive_le32dec(file_header.unp_size);
  }

  if (rar->packed_size < 0 || rar->unp_size < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid sizes specified.");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_remaining = rar->packed_size;

  /* TODO: RARv3 subblocks contain comments. For now the complete block is
   * consumed at the end.
   */
  if (head_type == NEWSUB_HEAD) {
    size_t distance = p - (const char *)h;
    header_size += rar->packed_size;
    /* Make sure we have the extended data. */
    if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
        return (ARCHIVE_FATAL);
    p = h;
    endp = p + header_size - 7;
    p += distance;
  }

  filename_size = archive_le16dec(file_header.name_size);
  if (p + filename_size > endp) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid filename size");
    return (ARCHIVE_FATAL);
  }
  if (rar->filename_allocated < filename_size * 2 + 2) {
    char *newptr;
    size_t newsize = filename_size * 2 + 2;
    newptr = realloc(rar->filename, newsize);
    if (newptr == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Couldn't allocate memory.");
      return (ARCHIVE_FATAL);
    }
    rar->filename = newptr;
    rar->filename_allocated = newsize;
  }
  filename = rar->filename;
  memcpy(filename, p, filename_size);
  filename[filename_size] = '\0';
  if (rar->file_flags & FHD_UNICODE)
  {
    if (filename_size != strlen(filename))
    {
      unsigned char highbyte, flagbits, flagbyte;
      unsigned fn_end, offset;

      end = filename_size;
      fn_end = filename_size * 2;
      filename_size = 0;
      offset = (unsigned)strlen(filename) + 1;
      highbyte = *(p + offset++);
      flagbits = 0;
      flagbyte = 0;
      while (offset < end && filename_size < fn_end)
      {
        if (!flagbits)
        {
          flagbyte = *(p + offset++);
          flagbits = 8;
        }

        flagbits -= 2;
        switch((flagbyte >> flagbits) & 3)
        {
          case 0:
            filename[filename_size++] = '\0';
            filename[filename_size++] = *(p + offset++);
            break;
          case 1:
            filename[filename_size++] = highbyte;
            filename[filename_size++] = *(p + offset++);
            break;
          case 2:
            filename[filename_size++] = *(p + offset + 1);
            filename[filename_size++] = *(p + offset);
            offset += 2;
            break;
          case 3:
          {
            char extra, high;
            uint8_t length = *(p + offset++);

            if (length & 0x80) {
              extra = *(p + offset++);
              high = (char)highbyte;
            } else
              extra = high = 0;
            length = (length & 0x7f) + 2;
            while (length && filename_size < fn_end) {
              unsigned cp = filename_size >> 1;
              filename[filename_size++] = high;
              filename[filename_size++] = p[cp] + extra;
              length--;
            }
          }
          break;
        }
      }
      if (filename_size > fn_end) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid filename");
        return (ARCHIVE_FATAL);
      }
      filename[filename_size++] = '\0';
      /*
       * Do not increment filename_size here as the computations below
       * add the space for the terminating NUL explicitly.
       */
      filename[filename_size] = '\0';

      /* Decoded unicode form is UTF-16BE, so we have to update a string
       * conversion object for it. */
      if (rar->sconv_utf16be == NULL) {
        rar->sconv_utf16be = archive_string_conversion_from_charset(
           &a->archive, "UTF-16BE", 1);
        if (rar->sconv_utf16be == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf16be;

      strp = filename;
      while (memcmp(strp, "\x00\x00", 2))
      {
        if (!memcmp(strp, "\x00\\", 2))
          *(strp + 1) = '/';
        strp += 2;
      }
      p += offset;
    } else {
      /*
       * If FHD_UNICODE is set but no unicode data, this file name form
       * is UTF-8, so we have to update a string conversion object for
       * it accordingly.
       */
      if (rar->sconv_utf8 == NULL) {
        rar->sconv_utf8 = archive_string_conversion_from_charset(
           &a->archive, "UTF-8", 1);
        if (rar->sconv_utf8 == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf8;
      while ((strp = strchr(filename, '\\')) != NULL)
        *strp = '/';
      p += filename_size;
    }
  }
  else
  {
    fn_sconv = sconv;
    while ((strp = strchr(filename, '\\')) != NULL)
      *strp = '/';
    p += filename_size;
  }

  /* Split file in multivolume RAR. No more need to process header. */
  if (rar->filename_save &&
    filename_size == rar->filename_save_size &&
    !memcmp(rar->filename, rar->filename_save, filename_size + 1))
  {
    __archive_read_consume(a, header_size - 7);
    rar->cursor++;
    if (rar->cursor >= rar->nodes)
    {
      rar->nodes++;
      if ((rar->dbo =
        realloc(rar->dbo, sizeof(*rar->dbo) * rar->nodes)) == NULL)
      {
        archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
        return (ARCHIVE_FATAL);
      }
      rar->dbo[rar->cursor].header_size = header_size;
      rar->dbo[rar->cursor].start_offset = -1;
      rar->dbo[rar->cursor].end_offset = -1;
    }
    if (rar->dbo[rar->cursor].start_offset < 0)
    {
      rar->dbo[rar->cursor].start_offset = a->filter->position;
      rar->dbo[rar->cursor].end_offset = rar->dbo[rar->cursor].start_offset +
        rar->packed_size;
    }
    return ret;
  }
  else if (rar->filename_must_match)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Mismatch of file parts split across multi-volume archive");
    return (ARCHIVE_FATAL);
  }

  rar->filename_save = (char*)realloc(rar->filename_save,
                                      filename_size + 1);
  memcpy(rar->filename_save, rar->filename, filename_size + 1);
  rar->filename_save_size = filename_size;

  /* Set info for seeking */
  free(rar->dbo);
  if ((rar->dbo = calloc(1, sizeof(*rar->dbo))) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->dbo[0].header_size = header_size;
  rar->dbo[0].start_offset = -1;
  rar->dbo[0].end_offset = -1;
  rar->cursor = 0;
  rar->nodes = 1;

  if (rar->file_flags & FHD_SALT)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(rar->salt, p, 8);
    p += 8;
  }

  if (rar->file_flags & FHD_EXTTIME) {
    if (read_exttime(p, rar, endp) < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
  }

  __archive_read_consume(a, header_size - 7);
  rar->dbo[0].start_offset = a->filter->position;
  rar->dbo[0].end_offset = rar->dbo[0].start_offset + rar->packed_size;

  switch(file_header.host_os)
  {
  case OS_MSDOS:
  case OS_OS2:
  case OS_WIN32:
    rar->mode = archive_le32dec(file_header.file_attr);
    if (rar->mode & FILE_ATTRIBUTE_DIRECTORY)
      rar->mode = AE_IFDIR | S_IXUSR | S_IXGRP | S_IXOTH;
    else
      rar->mode = AE_IFREG;
    rar->mode |= S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    break;

  case OS_UNIX:
  case OS_MAC_OS:
  case OS_BEOS:
    rar->mode = archive_le32dec(file_header.file_attr);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unknown file attributes from RAR file's host OS");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_uncopied = rar->bytes_unconsumed = 0;
  rar->lzss.position = rar->offset = 0;
  rar->offset_seek = 0;
  rar->dictionary_size = 0;
  rar->offset_outgoing = 0;
  rar->br.cache_avail = 0;
  rar->br.avail_in = 0;
  rar->crc_calculated = 0;
  rar->entry_eof = 0;
  rar->valid = 1;
  rar->is_ppmd_block = 0;
  rar->start_new_table = 1;
  free(rar->unp_buffer);
  rar->unp_buffer = NULL;
  rar->unp_offset = 0;
  rar->unp_buffer_size = UNP_BUFFER_SIZE;
  memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context);
  rar->ppmd_valid = rar->ppmd_eod = 0;
  rar->filters.filterstart = INT64_MAX;

  /* Don't set any archive entries for non-file header types */
  if (head_type == NEWSUB_HEAD)
    return ret;

  archive_entry_set_mtime(entry, rar->mtime, rar->mnsec);
  archive_entry_set_ctime(entry, rar->ctime, rar->cnsec);
  archive_entry_set_atime(entry, rar->atime, rar->ansec);
  archive_entry_set_size(entry, rar->unp_size);
  archive_entry_set_mode(entry, rar->mode);

  if (archive_entry_copy_pathname_l(entry, filename, filename_size, fn_sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for Pathname");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Pathname cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(fn_sconv));
    ret = (ARCHIVE_WARN);
  }

  if (((rar->mode) & AE_IFMT) == AE_IFLNK)
  {
    /* Make sure a symbolic-link file does not have its body. */
    rar->bytes_remaining = 0;
    archive_entry_set_size(entry, 0);

    /* Read a symbolic-link name. */
    if ((ret2 = read_symlink_stored(a, entry, sconv)) < (ARCHIVE_WARN))
      return ret2;
    if (ret > ret2)
      ret = ret2;
  }

  if (rar->bytes_remaining == 0)
    rar->entry_eof = 1;

  return ret;
}